

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

int link_send_disposition(LINK_HANDLE link,delivery_number message_id,AMQP_VALUE delivery_state)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  iVar3 = 0;
  if (delivery_state != (AMQP_VALUE)0x0) {
    iVar1 = send_disposition(link,message_id,delivery_state);
    iVar3 = 0;
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      iVar3 = 0x63c;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_send_disposition",0x63b,1,"Cannot send disposition frame");
      }
    }
  }
  return iVar3;
}

Assistant:

int link_send_disposition(LINK_HANDLE link, delivery_number message_id, AMQP_VALUE delivery_state)
{
    int result;

    if (delivery_state == NULL)
    {
        result = 0;
    }
    else
    {
        result = send_disposition(link, message_id, delivery_state);
        if (result != 0)
        {
            LogError("Cannot send disposition frame");
            result = MU_FAILURE;
        }
    }

    return result;
}